

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.h
# Opt level: O0

bool __thiscall Clasp::ShortImplicationsGraph::ImplicationList::empty(ImplicationList *this)

{
  bool bVar1;
  __pointer_type pBVar2;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *in_RDI;
  undefined1 local_9;
  
  bVar1 = bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
          ::empty(in_RDI);
  local_9 = false;
  if (bVar1) {
    pBVar2 = std::atomic::operator_cast_to_Block_
                       ((atomic<Clasp::ShortImplicationsGraph::Block_*> *)0x120433);
    local_9 = pBVar2 == (__pointer_type)0x0;
  }
  return local_9;
}

Assistant:

bool empty() const { return ImpListBase::empty() && learnt == static_cast<Block*>(0); }